

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_sockets.cc
# Opt level: O0

void __thiscall AllReduceSockets::all_reduce_init(AllReduceSockets *this)

{
  uint16_t uVar1;
  int iVar2;
  socket_t sVar3;
  char *pcVar4;
  ostream *poVar5;
  int *piVar6;
  undefined8 uVar7;
  ssize_t sVar8;
  string *pmessage;
  void *pvVar9;
  long in_RDI;
  char __errmsg_2 [256];
  stringstream __msg_3;
  socket_t f;
  socklen_t size;
  sockaddr_in child_address;
  int i;
  char dotted_quad [16];
  char __errmsg_1 [256];
  stringstream __msg_2;
  int in_stack_000005b0;
  uint32_t in_stack_000005b4;
  bool listening;
  sockaddr_in address;
  unsigned_short netport;
  socket_t sock;
  uint32_t parent_ip;
  uint16_t parent_port;
  uint16_t kid_count;
  stringstream __msg_1;
  int ok;
  socket_t master_sock;
  uint32_t master_ip;
  char __errmsg [256];
  stringstream __msg;
  hostent *master;
  string *in_stack_fffffffffffff568;
  undefined8 in_stack_fffffffffffff570;
  char *in_stack_fffffffffffff578;
  undefined4 in_stack_fffffffffffff580;
  undefined4 in_stack_fffffffffffff584;
  undefined4 uVar10;
  char local_a28 [264];
  stringstream local_920 [16];
  ostream local_910;
  int local_794;
  socklen_t local_790;
  sockaddr local_78c;
  int local_77c;
  char local_778 [31];
  undefined1 local_759;
  char local_738 [264];
  stringstream local_630 [16];
  ostream local_620;
  byte local_4a5;
  sockaddr local_4a4;
  uint16_t local_492;
  int local_490;
  uint local_48c;
  ushort local_486;
  ushort local_484;
  undefined1 local_481;
  stringstream local_460 [16];
  ostream local_450;
  int local_2d8;
  socket_t local_2d4;
  undefined4 local_2d0;
  undefined1 local_2c9;
  char local_2a8 [272];
  stringstream local_198 [16];
  ostream local_188;
  hostent *local_10;
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  local_10 = gethostbyname(pcVar4);
  iVar2 = (int)((ulong)in_stack_fffffffffffff570 >> 0x20);
  if (local_10 == (hostent *)0x0) {
    std::__cxx11::stringstream::stringstream(local_198);
    poVar5 = std::operator<<(&local_188,"gethostbyname(");
    poVar5 = std::operator<<(poVar5,(string *)(in_RDI + 0x48));
    std::operator<<(poVar5,")");
    piVar6 = __errno_location();
    pcVar4 = strerror_r(*piVar6,local_2a8,0x100);
    if (pcVar4 == (char *)0x0) {
      poVar5 = std::operator<<(&local_188,"errno = ");
      std::operator<<(poVar5,local_2a8);
    }
    else {
      std::operator<<(&local_188,"errno = unknown");
    }
    local_2c9 = 1;
    uVar7 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              ((vw_exception *)CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580),
               in_stack_fffffffffffff578,iVar2,in_stack_fffffffffffff568);
    local_2c9 = 0;
    __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 0x18),(string *)(in_RDI + 0x48));
  uVar10 = *(undefined4 *)*local_10->h_addr_list;
  local_2d0 = uVar10;
  htons((uint16_t)*(undefined4 *)(in_RDI + 0x68));
  local_2d4 = sock_connect(in_stack_000005b4,in_stack_000005b0);
  sVar8 = send(local_2d4,(void *)(in_RDI + 0x70),8,0);
  if (sVar8 < 8) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"write unique_id=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(ulong *)(in_RDI + 0x70));
    poVar5 = std::operator<<(poVar5," to span server failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"wrote unique_id=");
    pvVar9 = (void *)std::ostream::operator<<(poVar5,*(ulong *)(in_RDI + 0x70));
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  }
  sVar8 = send(local_2d4,(void *)(in_RDI + 8),8,0);
  if (sVar8 < 8) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"write total=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(ulong *)(in_RDI + 8));
    poVar5 = std::operator<<(poVar5," to span server failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"wrote total=");
    pvVar9 = (void *)std::ostream::operator<<(poVar5,*(ulong *)(in_RDI + 8));
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  }
  sVar8 = send(local_2d4,(void *)(in_RDI + 0x10),8,0);
  if (sVar8 < 8) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"write node=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(ulong *)(in_RDI + 0x10));
    poVar5 = std::operator<<(poVar5," to span server failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"wrote node=");
    pvVar9 = (void *)std::ostream::operator<<(poVar5,*(ulong *)(in_RDI + 0x10));
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  }
  sVar8 = recv(local_2d4,&local_2d8,4,0);
  if (sVar8 < 4) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"read ok from span server failed");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"read ok=");
    pvVar9 = (void *)std::ostream::operator<<(poVar5,local_2d8);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  }
  iVar2 = (int)((ulong)in_stack_fffffffffffff570 >> 0x20);
  if (local_2d8 != 0) {
    sVar8 = recv(local_2d4,&local_484,2,0);
    if (sVar8 < 2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"read kid_count from span server failed");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"read kid_count=");
      pvVar9 = (void *)std::ostream::operator<<(poVar5,local_484);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    }
    local_490 = -1;
    local_492 = htons(0x67b0);
    if (local_484 != 0) {
      local_490 = getsock();
      local_4a4.sa_family = 2;
      local_4a4.sa_data._2_4_ = htonl(0);
      local_4a4.sa_data[0] = (undefined1)local_492;
      local_4a4.sa_data[1] = local_492._1_1_;
      local_4a5 = 0;
      while (((local_4a5 ^ 0xff) & 1) != 0) {
        iVar2 = bind(local_490,&local_4a4,0x10);
        if (iVar2 < 0) {
          piVar6 = __errno_location();
          iVar2 = (int)((ulong)in_stack_fffffffffffff570 >> 0x20);
          if (*piVar6 != 0x62) {
            std::__cxx11::stringstream::stringstream(local_630);
            std::operator<<(&local_620,"bind");
            piVar6 = __errno_location();
            pcVar4 = strerror_r(*piVar6,local_738,0x100);
            if (pcVar4 == (char *)0x0) {
              poVar5 = std::operator<<(&local_620,"errno = ");
              std::operator<<(poVar5,local_738);
              iVar2 = (int)((ulong)poVar5 >> 0x20);
            }
            else {
              std::operator<<(&local_620,"errno = unknown");
            }
            local_759 = 1;
            pmessage = (string *)__cxa_allocate_exception(0x38);
            std::__cxx11::stringstream::str();
            VW::vw_exception::vw_exception
                      ((vw_exception *)CONCAT44(uVar10,in_stack_fffffffffffff580),
                       in_stack_fffffffffffff578,iVar2,pmessage);
            local_759 = 0;
            __cxa_throw(pmessage,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
          }
          uVar1 = ntohs(local_492);
          local_4a4.sa_data._0_2_ = htons(uVar1 + 1);
          local_492 = local_4a4.sa_data._0_2_;
        }
        else {
          iVar2 = listen(local_490,(uint)local_484);
          if (iVar2 < 0) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"listen: ");
            piVar6 = __errno_location();
            pcVar4 = strerror(*piVar6);
            poVar5 = std::operator<<(poVar5,pcVar4);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            close(local_490);
            local_490 = getsock();
          }
          else {
            local_4a5 = 1;
          }
        }
      }
    }
    sVar8 = send(local_2d4,&local_492,2,0);
    if (sVar8 < 2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"write netport failed!");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    sVar8 = recv(local_2d4,&local_48c,4,0);
    if (sVar8 < 4) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"read parent_ip failed!");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      pcVar4 = inet_ntop(2,&local_48c,local_778,0x10);
      if (pcVar4 == (char *)0x0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"read parent_ip=");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_48c);
        poVar5 = std::operator<<(poVar5,"(inet_ntop: ");
        piVar6 = __errno_location();
        pcVar4 = strerror(*piVar6);
        poVar5 = std::operator<<(poVar5,pcVar4);
        poVar5 = std::operator<<(poVar5,")");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,"read parent_ip=");
        poVar5 = std::operator<<(poVar5,local_778);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
    }
    sVar8 = recv(local_2d4,&local_486,2,0);
    if (sVar8 < 2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"read parent_port failed!");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"read parent_port=");
      pvVar9 = (void *)std::ostream::operator<<(poVar5,local_486);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    }
    close(local_2d4);
    if (local_48c == 0xffffffff) {
      *(undefined4 *)(in_RDI + 0x38) = 0xffffffff;
    }
    else {
      sVar3 = sock_connect(in_stack_000005b4,in_stack_000005b0);
      *(socket_t *)(in_RDI + 0x38) = sVar3;
    }
    *(undefined4 *)(in_RDI + 0x3c) = 0xffffffff;
    *(undefined4 *)(in_RDI + 0x40) = 0xffffffff;
    local_77c = 0;
    while( true ) {
      if ((int)(uint)local_484 <= local_77c) {
        if (local_484 != 0) {
          close(local_490);
        }
        return;
      }
      local_790 = 0x10;
      local_794 = accept(local_490,&local_78c,&local_790);
      iVar2 = (int)((ulong)in_stack_fffffffffffff570 >> 0x20);
      if (local_794 < 0) break;
      *(int *)(in_RDI + 0x3c + (long)local_77c * 4) = local_794;
      local_77c = local_77c + 1;
    }
    std::__cxx11::stringstream::stringstream(local_920);
    std::operator<<(&local_910,"accept");
    piVar6 = __errno_location();
    pcVar4 = strerror_r(*piVar6,local_a28,0x100);
    if (pcVar4 == (char *)0x0) {
      poVar5 = std::operator<<(&local_910,"errno = ");
      std::operator<<(poVar5,local_a28);
    }
    else {
      std::operator<<(&local_910,"errno = unknown");
    }
    uVar7 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              ((vw_exception *)CONCAT44(uVar10,in_stack_fffffffffffff580),in_stack_fffffffffffff578,
               iVar2,in_stack_fffffffffffff568);
    __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  std::__cxx11::stringstream::stringstream(local_460);
  std::operator<<(&local_450,"mapper already connected");
  local_481 = 1;
  pcVar4 = (char *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            ((vw_exception *)CONCAT44(uVar10,in_stack_fffffffffffff580),pcVar4,iVar2,
             in_stack_fffffffffffff568);
  local_481 = 0;
  __cxa_throw(pcVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void AllReduceSockets::all_reduce_init()
{
#ifdef _WIN32
  WSAData wsaData;
  int lastError = WSAStartup(MAKEWORD(2, 2), &wsaData);
  if (lastError != 0)
    THROWERRNO("WSAStartup() returned error:" << lastError);
#endif

  struct hostent* master = gethostbyname(span_server.c_str());

  if (master == nullptr)
    THROWERRNO("gethostbyname(" << span_server << ")");

  socks.current_master = span_server;

  uint32_t master_ip = *((uint32_t*)master->h_addr);

  socket_t master_sock = sock_connect(master_ip, htons(port));
  if (send(master_sock, (const char*)&unique_id, sizeof(unique_id), 0) < (int)sizeof(unique_id))
    cerr << "write unique_id=" << unique_id << " to span server failed" << endl;
  else
    cerr << "wrote unique_id=" << unique_id << endl;
  if (send(master_sock, (const char*)&total, sizeof(total), 0) < (int)sizeof(total))
    cerr << "write total=" << total << " to span server failed" << endl;
  else
    cerr << "wrote total=" << total << endl;
  if (send(master_sock, (char*)&node, sizeof(node), 0) < (int)sizeof(node))
    cerr << "write node=" << node << " to span server failed" << endl;
  else
    cerr << "wrote node=" << node << endl;
  int ok;
  if (recv(master_sock, (char*)&ok, sizeof(ok), 0) < (int)sizeof(ok))
    cerr << "read ok from span server failed" << endl;
  else
    cerr << "read ok=" << ok << endl;
  if (!ok)
    THROW("mapper already connected");

  uint16_t kid_count;
  uint16_t parent_port;
  uint32_t parent_ip;

  if (recv(master_sock, (char*)&kid_count, sizeof(kid_count), 0) < (int)sizeof(kid_count))
    cerr << "read kid_count from span server failed" << endl;
  else
    cerr << "read kid_count=" << kid_count << endl;

  socket_t sock = -1;
  short unsigned int netport = htons(26544);
  if (kid_count > 0)
  {
    sock = getsock();
    sockaddr_in address;
    address.sin_family = AF_INET;
    address.sin_addr.s_addr = htonl(INADDR_ANY);
    address.sin_port = netport;

    bool listening = false;
    while (!listening)
    {
      if (::bind(sock, (sockaddr*)&address, sizeof(address)) < 0)
      {
#ifdef _WIN32
        if (WSAGetLastError() == WSAEADDRINUSE)
#else
        if (errno == EADDRINUSE)
#endif
        {
          netport = htons(ntohs(netport) + 1);
          address.sin_port = netport;
        }
        else
          THROWERRNO("bind");
      }
      else
      {
        if (listen(sock, kid_count) < 0)
        {
          cerr << "listen: " << strerror(errno) << endl;
          CLOSESOCK(sock);
          sock = getsock();
        }
        else
        {
          listening = true;
        }
      }
    }
  }

  if (send(master_sock, (const char*)&netport, sizeof(netport), 0) < (int)sizeof(netport))
    cerr << "write netport failed!" << endl;

  if (recv(master_sock, (char*)&parent_ip, sizeof(parent_ip), 0) < (int)sizeof(parent_ip))
    cerr << "read parent_ip failed!" << endl;
  else
  {
    char dotted_quad[INET_ADDRSTRLEN];
    if (nullptr == inet_ntop(AF_INET, (char*)&parent_ip, dotted_quad, INET_ADDRSTRLEN))
    {
      cerr << "read parent_ip=" << parent_ip << "(inet_ntop: " << strerror(errno) << ")" << endl;
    }
    else
      cerr << "read parent_ip=" << dotted_quad << endl;
  }
  if (recv(master_sock, (char*)&parent_port, sizeof(parent_port), 0) < (int)sizeof(parent_port))
    cerr << "read parent_port failed!" << endl;
  else
    cerr << "read parent_port=" << parent_port << endl;

  CLOSESOCK(master_sock);

  if (parent_ip != (uint32_t)-1)
  {
    socks.parent = sock_connect(parent_ip, parent_port);
  }
  else
    socks.parent = -1;

  socks.children[0] = -1;
  socks.children[1] = -1;
  for (int i = 0; i < kid_count; i++)
  {
    sockaddr_in child_address;
    socklen_t size = sizeof(child_address);
    socket_t f = accept(sock, (sockaddr*)&child_address, &size);
    if (f < 0)
      THROWERRNO("accept");

    // char hostname[NI_MAXHOST];
    // char servInfo[NI_MAXSERV];
    // getnameinfo((sockaddr *) &child_address, sizeof(sockaddr), hostname, NI_MAXHOST, servInfo, NI_MAXSERV,
    // NI_NUMERICSERV); cerr << "connected to " << hostname << ':' << ntohs(port) << endl;
    socks.children[i] = f;
  }

  if (kid_count > 0)
    CLOSESOCK(sock);
}